

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::RegisterParameterizedTests(UnitTestImpl *this)

{
  long in_RDI;
  ParameterizedTestSuiteRegistry *unaff_retaddr;
  TypeParameterizedTestSuiteRegistry *in_stack_00000190;
  
  if ((*(byte *)(in_RDI + 0x160) & 1) == 0) {
    ParameterizedTestSuiteRegistry::RegisterTests(unaff_retaddr);
    TypeParameterizedTestSuiteRegistry::CheckForInstantiations(in_stack_00000190);
    *(undefined1 *)(in_RDI + 0x160) = 1;
  }
  return;
}

Assistant:

void UnitTestImpl::RegisterParameterizedTests() {
  if (!parameterized_tests_registered_) {
    parameterized_test_registry_.RegisterTests();
    type_parameterized_test_registry_.CheckForInstantiations();
    parameterized_tests_registered_ = true;
  }
}